

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

ssize_t Curl_h1_req_parse_read
                  (h1_req_parser *parser,char *buf,size_t buflen,char *scheme_default,int options,
                  CURLcode *err)

{
  dynbuf *s;
  CURLcode CVar1;
  CURLcode CVar2;
  CURLUcode CVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  size_t s_len;
  CURLU *u;
  ulong uVar8;
  char *a_len;
  char *scheme;
  size_t __n;
  ulong uVar9;
  char *authority;
  char *path;
  char *__n_00;
  ulong uVar10;
  bool bVar11;
  long local_2078;
  char local_2038 [8200];
  
  *err = CURLE_OK;
  if (parser->done == false) {
    s = &parser->scratch;
    local_2078 = 0;
    do {
      if (parser->line != (char *)0x0) {
        parser->line = (char *)0x0;
        parser->line_len = 0;
        Curl_dyn_reset(s);
      }
      pvVar4 = memchr(buf,10,buflen);
      if (pvVar4 == (void *)0x0) {
        uVar9 = 0xffffffffffffffff;
        CVar1 = CURLE_AGAIN;
      }
      else {
        parser->line = buf;
        uVar9 = (long)pvVar4 + (1 - (long)buf);
        parser->line_len = uVar9;
        CVar1 = CURLE_OK;
      }
      *err = CVar1;
      if ((long)uVar9 < 0) {
        uVar10 = uVar9;
        if (pvVar4 == (void *)0x0) {
          CVar1 = Curl_dyn_addn(s,buf,buflen);
          uVar9 = buflen;
          goto LAB_0013b58a;
        }
      }
      else {
        sVar5 = Curl_dyn_len(s);
        if (sVar5 != 0) {
          CVar1 = Curl_dyn_addn(s,parser->line,parser->line_len);
          *err = CVar1;
          uVar10 = 0xffffffffffffffff;
          if (CVar1 != CURLE_OK) goto LAB_0013b59b;
          pcVar6 = Curl_dyn_ptr(s);
          parser->line = pcVar6;
          sVar5 = Curl_dyn_len(s);
          parser->line_len = sVar5;
        }
        sVar5 = parser->line_len;
        if (sVar5 == 0) {
joined_r0x0013b649:
          CVar1 = CURLE_URL_MALFORMAT;
          if ((options & 1U) != 0) goto LAB_0013b58a;
        }
        else {
          if (parser->line[sVar5 - 1] == '\n') {
            parser->line_len = sVar5 - 1;
          }
          sVar5 = parser->line_len;
          if ((sVar5 == 0) || (parser->line[sVar5 - 1] != '\r')) goto joined_r0x0013b649;
          parser->line_len = sVar5 - 1;
        }
        CVar1 = (uint)(parser->max_line_len < parser->line_len) * 3;
LAB_0013b58a:
        *err = CVar1;
        uVar10 = -(ulong)(CVar1 != CURLE_OK) | uVar9;
      }
LAB_0013b59b:
      if ((long)uVar10 < 0) {
        if (*err != CURLE_AGAIN) {
          local_2078 = -1;
        }
        *err = CURLE_OK;
        return local_2078;
      }
      local_2078 = local_2078 + uVar10;
      buflen = buflen - uVar10;
      pcVar6 = parser->line;
      if (pcVar6 == (char *)0x0) {
        if (buflen == 0) {
          return local_2078;
        }
      }
      else {
        if (parser->req == (httpreq *)0x0) {
          uVar9 = parser->line_len;
          pvVar4 = memchr(pcVar6,0x20,uVar9);
          __n = (long)pvVar4 - (long)pcVar6;
          if (__n == 0 || pvVar4 == (void *)0x0) {
            CVar1 = CURLE_URL_MALFORMAT;
            u = (CURLU *)0x0;
          }
          else {
            if (__n < uVar9) {
              lVar7 = 0;
              uVar8 = uVar9;
              do {
                if (pcVar6[uVar8] == ' ') {
                  __n_00 = pcVar6 + ((~(ulong)pvVar4 + uVar9) - lVar7);
                  bVar11 = lVar7 != 0;
                  goto LAB_0013b6a7;
                }
                uVar8 = uVar8 - 1;
                lVar7 = lVar7 + 1;
              } while (__n < uVar8);
            }
            __n_00 = (char *)0x0;
            bVar11 = false;
LAB_0013b6a7:
            if (bVar11 && __n_00 != (char *)0x0) {
              path = (char *)((long)pvVar4 + 1);
              if ((__n_00 == (char *)0x1) && (*path == '*')) {
                __n_00 = (char *)0x1;
                authority = (char *)0x0;
                a_len = (char *)0x0;
                u = (CURLU *)0x0;
              }
              else {
                CVar2 = strncmp("CONNECT",pcVar6,__n);
                if (CVar2 == CURLE_OK) {
                  a_len = __n_00;
                  authority = path;
                  path = (char *)0x0;
                  __n_00 = (char *)0x0;
                }
                else {
                  if (*path != '/') {
                    if (__n_00 < (char *)0x2000) {
                      memcpy(local_2038,path,(size_t)__n_00);
                      local_2038[(long)__n_00] = '\0';
                      sVar5 = Curl_is_absolute_url(local_2038,(char *)0x0,0,false);
                      if (sVar5 == 0) {
                        CVar1 = CURLE_URL_MALFORMAT;
                        u = (CURLU *)0x0;
                      }
                      else {
                        u = curl_url();
                        if (u == (CURLU *)0x0) {
                          a_len = (char *)0x4;
                          CVar1 = CURLE_OUT_OF_MEMORY;
                          CVar2 = CURLE_OK;
                        }
                        else {
                          CVar3 = curl_url_set(u,CURLUPART_URL,local_2038,
                                               (uint)((options & 1U) == 0) << 0xb | 0x1a);
                          CVar2 = CONCAT31((int3)(CVar3 >> 8),CVar3 == CURLUE_OK);
                          a_len = (char *)((ulong)(CVar3 != CURLUE_OK) << 2);
                          CVar1 = CURLE_URL_MALFORMAT;
                        }
                        if ((char)CVar2 == '\0') goto LAB_0013b8d4;
                      }
                      CVar2 = -(options & 1U);
                      a_len = (char *)(ulong)((uint)(u == (CURLU *)0x0) << 2 & CVar2);
                    }
                    else {
                      a_len = (char *)0x4;
                      CVar1 = CURLE_URL_MALFORMAT;
                      u = (CURLU *)0x0;
                    }
LAB_0013b8d4:
                    if ((int)a_len == 4) goto LAB_0013b7e7;
                    if ((int)a_len != 0) goto LAB_0013b7f1;
                    authority = (char *)0x0;
                    goto LAB_0013b735;
                  }
                  a_len = (char *)0x0;
                  authority = (char *)0x0;
                }
                u = (CURLU *)0x0;
              }
LAB_0013b735:
              if (u != (CURLU *)0x0) {
                CVar1 = Curl_http_req_make2(&parser->req,pcVar6,__n,u,scheme_default);
                goto LAB_0013b7e7;
              }
              if (scheme_default == (char *)0x0) {
                scheme = (char *)0x0;
                s_len = 0;
              }
              else {
                s_len = strlen(scheme_default);
                scheme = scheme_default;
              }
              CVar1 = Curl_http_req_make(&parser->req,pcVar6,__n,scheme,s_len,authority,
                                         (size_t)a_len,path,(size_t)__n_00);
            }
            else {
              CVar1 = CURLE_URL_MALFORMAT;
            }
            u = (CURLU *)0x0;
          }
LAB_0013b7e7:
          curl_url_cleanup(u);
          CVar2 = CVar1;
        }
        else {
          if (parser->line_len == 0) {
            parser->done = true;
            Curl_dyn_reset(s);
            goto LAB_0013b801;
          }
          CVar2 = Curl_dynhds_h1_add_line(&parser->req->headers,pcVar6,parser->line_len);
        }
LAB_0013b7f1:
        *err = CVar2;
        if (CVar2 != CURLE_OK) {
          return -1;
        }
      }
LAB_0013b801:
      buf = buf + uVar10;
    } while (parser->done != true);
  }
  else {
    local_2078 = 0;
  }
  return local_2078;
}

Assistant:

ssize_t Curl_h1_req_parse_read(struct h1_req_parser *parser,
                               const char *buf, size_t buflen,
                               const char *scheme_default, int options,
                               CURLcode *err)
{
  ssize_t nread = 0, n;

  *err = CURLE_OK;
  while(!parser->done) {
    n = next_line(parser, buf, buflen, options, err);
    if(n < 0) {
      if(*err != CURLE_AGAIN) {
        nread = -1;
      }
      *err = CURLE_OK;
      goto out;
    }

    /* Consume this line */
    nread += (size_t)n;
    buf += (size_t)n;
    buflen -= (size_t)n;

    if(!parser->line) {
      /* consumed bytes, but line not complete */
      if(!buflen)
        goto out;
    }
    else if(!parser->req) {
      *err = start_req(parser, scheme_default, options);
      if(*err) {
        nread = -1;
        goto out;
      }
    }
    else if(parser->line_len == 0) {
      /* last, empty line, we are finished */
      if(!parser->req) {
        *err = CURLE_URL_MALFORMAT;
        nread = -1;
        goto out;
      }
      parser->done = TRUE;
      Curl_dyn_reset(&parser->scratch);
      /* last chance adjustments */
    }
    else {
      *err = Curl_dynhds_h1_add_line(&parser->req->headers,
                                     parser->line, parser->line_len);
      if(*err) {
        nread = -1;
        goto out;
      }
    }
  }

out:
  return nread;
}